

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcLightSourcePositional).super_IfcLightSource.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  plVar1 = (long *)(&(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x40 +
                   (long)p_Var2);
  plVar1[-8] = 0x8648c8;
  plVar1[0x16] = 0x864940;
  plVar1[-6] = 0x8648f0;
  plVar1[-4] = 0x864918;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcLightSourcePositional).super_IfcLightSource.
                          super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2),0x108);
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}